

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O3

void __thiscall
bioparser::test::BioparserMhapTest_CompressedParseInChunks_Test::TestBody
          (BioparserMhapTest_CompressedParseInChunks_Test *this)

{
  Parser<bioparser::test::MhapOverlap> *pPVar1;
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  local_78;
  string local_58;
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sample.mhap.gz","");
  BioparserMhapTest::Setup(&this->super_BioparserMhapTest,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pPVar1 = (this->super_BioparserMhapTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_false>.
           _M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_78,pPVar1,0x400,1);
  if (local_78.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      vector<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>,std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>>>
      ::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>*,std::vector<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>,std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>>>>>>
                ((vector<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>,std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,std::default_delete<bioparser::test::MhapOverlap>>>>
                  *)&(this->super_BioparserMhapTest).o,
                 (this->super_BioparserMhapTest).o.
                 super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pPVar1 = (this->super_BioparserMhapTest).p._M_t.
               super___uniq_ptr_impl<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
               .super__Head_base<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_false>.
               _M_head_impl;
      (*pPVar1->_vptr_Parser[2])(&local_38,pPVar1,0x400,1);
      local_58.field_2._M_allocated_capacity =
           (size_type)
           local_78.
           super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58._M_string_length =
           (size_type)
           local_78.
           super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58._M_dataplus._M_p =
           (pointer)local_78.
                    super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_78.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_38.
           super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_38.
           super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_78.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_38.
           super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.
      super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ::~vector((vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
                 *)&local_58);
      std::
      vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
      ::~vector(&local_38);
    } while (local_78.
             super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_78.
             super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  ::~vector(&local_78);
  BioparserMhapTest::Check(&this->super_BioparserMhapTest);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, CompressedParseInChunks) {
  Setup("sample.mhap.gz");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}